

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offBasePtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  U32 UVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  ZSTD_matchState_t *pZVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  byte *pbVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char cVar15;
  uint uVar16;
  byte *pbVar17;
  BYTE *pBVar18;
  U32 *pUVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong *puVar23;
  ulong uVar24;
  U32 *pUVar25;
  ulong *puVar26;
  BYTE *pBVar27;
  uint uVar28;
  uint uVar29;
  U32 *pUVar30;
  uint uVar31;
  ulong *puVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong *puVar36;
  U32 UVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  byte *pbVar41;
  U32 *pUVar42;
  ulong *puVar43;
  bool bVar44;
  BYTE *pInLoopLimit;
  U32 dummy32;
  uint local_124;
  U32 *local_110;
  byte *local_108;
  byte *local_100;
  U32 *local_e0;
  ulong local_d0;
  uint local_c0;
  U32 local_70;
  U32 local_6c;
  U32 *local_68;
  ulong local_60;
  U32 *local_58;
  BYTE *local_50;
  ulong *local_48;
  ulong *local_40;
  ulong *local_38;
  
  uVar7 = (ms->cParams).hashLog;
  if (0x20 < uVar7) goto LAB_001b6d11;
  local_60 = (ulong)(mls - 5);
  cVar15 = (char)uVar7;
  switch(local_60) {
  case 0:
    lVar9 = -0x30e4432345000000;
    break;
  case 1:
    lVar9 = -0x30e4432340650000;
    break;
  case 2:
    lVar9 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar8 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_001b6127;
  default:
    uVar8 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar15 & 0x1fU));
    goto LAB_001b612c;
  }
  uVar8 = lVar9 * *(long *)ip;
LAB_001b6127:
  uVar8 = uVar8 >> (-cVar15 & 0x3fU);
LAB_001b612c:
  pBVar3 = (ms->window).base;
  uVar31 = (int)ip - (int)pBVar3;
  uVar7 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  UVar2 = (ms->window).lowLimit;
  UVar37 = uVar31 - uVar7;
  if (uVar31 - UVar2 <= uVar7) {
    UVar37 = UVar2;
  }
  if (ms->loadedDictEnd != 0) {
    UVar37 = UVar2;
  }
  uVar40 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar7 = uVar31 - uVar40;
  if (uVar31 < uVar40) {
    uVar7 = 0;
  }
  uVar38 = UVar37;
  if (UVar37 < uVar7) {
    uVar38 = uVar7;
  }
  local_124 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  if (iend + -8 < ip) {
    __assert_fail("ip <= iend-8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x747b,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if (dictMode == ZSTD_dedicatedDictSearch) {
    __assert_fail("dictMode != ZSTD_dedicatedDictSearch",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x747c,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_58 = ms->hashTable;
  pUVar42 = ms->chainTable;
  uVar34 = local_58[uVar8];
  uVar24 = 0;
  uVar28 = local_124;
  if (uVar38 < uVar34) {
    uVar12 = 0;
    do {
      uVar24 = (ulong)uVar34;
      uVar13 = (ulong)((uVar34 & uVar40) * 2);
      if ((pUVar42[uVar13 + 1] != 1) || (uVar28 < 2)) {
        uVar24 = uVar12;
        if (pUVar42[uVar13 + 1] == 1) {
          (pUVar42 + uVar13)[0] = 0;
          (pUVar42 + uVar13)[1] = 0;
        }
        break;
      }
      pUVar42[uVar13 + 1] = (U32)uVar12;
      uVar28 = uVar28 - 1;
      uVar34 = pUVar42[uVar13];
      uVar12 = uVar24;
    } while (uVar38 < uVar34);
  }
  local_68 = pUVar42;
  if ((int)uVar24 != 0) {
    pBVar4 = (ms->window).dictBase;
    do {
      uVar34 = (ms->window).dictLimit;
      pbVar17 = (byte *)(ulong)uVar34;
      local_48 = (ulong *)(pBVar4 + (long)pbVar17);
      uVar35 = (uint)uVar24;
      puVar43 = (ulong *)iend;
      pBVar18 = pBVar3;
      if (uVar35 < uVar34) {
        puVar43 = local_48;
        pBVar18 = pBVar4;
      }
      uVar39 = (ms->window).lowLimit;
      uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar16 = uVar35 - uVar20;
      if (uVar35 - uVar39 <= uVar20) {
        uVar16 = uVar39;
      }
      if (uVar35 < uVar38) {
        __assert_fail("curr >= btLow",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x73d4,
                      "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      puVar26 = (ulong *)(pBVar18 + uVar24);
      if (puVar43 <= puVar26) {
        __assert_fail("ip < iend",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x73d5,
                      "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                     );
      }
      uVar39 = pUVar42[(ulong)((uVar35 & uVar40) * 2) + 1];
      uVar33 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar20 = (uVar35 & uVar33) * 2;
      local_110 = pUVar42 + uVar20;
      local_e0 = local_110 + 1;
      if ((uVar28 != 0) && (uVar20 = pUVar42[uVar20], uVar16 < uVar20)) {
        local_50 = pBVar3 + (long)pbVar17;
        local_38 = (ulong *)((long)puVar43 + -3);
        local_40 = (ulong *)((long)puVar43 + -1);
        local_108 = (byte *)0x0;
        local_100 = (byte *)0x0;
        uVar29 = uVar28;
        do {
          pbVar11 = local_100;
          if (local_108 < local_100) {
            pbVar11 = local_108;
          }
          if (uVar35 <= uVar20) {
            __assert_fail("matchIndex < curr",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x73da,
                          "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                         );
          }
          pBVar18 = pBVar3;
          if (dictMode == ZSTD_extDict) {
            if ((uVar35 < uVar34) || (pbVar17 <= pbVar11 + uVar20)) {
              if (pbVar11 + uVar20 < pbVar17) {
                pBVar18 = pBVar4;
              }
              goto LAB_001b6452;
            }
            sVar10 = ZSTD_count_2segments
                               ((byte *)((long)puVar26 + (long)pbVar11),
                                pBVar4 + uVar20 + (long)pbVar11,(BYTE *)puVar43,(BYTE *)local_48,
                                local_50);
            pbVar11 = pbVar11 + sVar10;
            pBVar18 = pBVar3 + uVar20;
            pUVar42 = local_68;
            if (pbVar11 + uVar20 < pbVar17) {
              pBVar18 = pBVar4 + uVar20;
            }
          }
          else {
LAB_001b6452:
            if ((uVar34 <= uVar35) && (pbVar11 + uVar20 < pbVar17)) {
              __assert_fail("(matchIndex+matchLength >= dictLimit) || (curr < dictLimit)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x73e6,
                            "void ZSTD_insertDUBT1(const ZSTD_matchState_t *, U32, const BYTE *, U32, U32, const ZSTD_dictMode_e)"
                           );
            }
            puVar23 = (ulong *)((long)puVar26 + (long)pbVar11);
            puVar32 = (ulong *)(pBVar18 + uVar20 + (long)pbVar11);
            puVar36 = puVar23;
            if (puVar23 < (ulong *)((long)puVar43 - 7U)) {
              uVar12 = *puVar23 ^ *puVar32;
              uVar24 = 0;
              if (uVar12 != 0) {
                for (; (uVar12 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                }
              }
              pbVar41 = (byte *)(uVar24 >> 3 & 0x1fffffff);
              if (*puVar32 == *puVar23) {
                do {
                  puVar36 = puVar36 + 1;
                  puVar32 = puVar32 + 1;
                  if ((ulong *)((long)puVar43 - 7U) <= puVar36) goto LAB_001b64d9;
                  uVar12 = *puVar36 ^ *puVar32;
                  uVar24 = 0;
                  if (uVar12 != 0) {
                    for (; (uVar12 >> uVar24 & 1) == 0; uVar24 = uVar24 + 1) {
                    }
                  }
                  pbVar41 = (byte *)((long)puVar36 + ((uVar24 >> 3 & 0x1fffffff) - (long)puVar23));
                } while (*puVar32 == *puVar36);
              }
            }
            else {
LAB_001b64d9:
              if ((puVar36 < local_38) && ((int)*puVar32 == (int)*puVar36)) {
                puVar36 = (ulong *)((long)puVar36 + 4);
                puVar32 = (ulong *)((long)puVar32 + 4);
              }
              if ((puVar36 < local_40) && ((short)*puVar32 == (short)*puVar36)) {
                puVar36 = (ulong *)((long)puVar36 + 2);
                puVar32 = (ulong *)((long)puVar32 + 2);
              }
              if (puVar36 < puVar43) {
                puVar36 = (ulong *)((long)puVar36 + (ulong)((byte)*puVar32 == (byte)*puVar36));
              }
              pbVar41 = (byte *)((long)puVar36 - (long)puVar23);
            }
            pbVar11 = pbVar41 + (long)pbVar11;
            pBVar18 = pBVar18 + uVar20;
          }
          if ((ulong *)((long)puVar26 + (long)pbVar11) == puVar43) {
            bVar44 = false;
          }
          else {
            pUVar25 = pUVar42 + (uVar20 & uVar33) * 2;
            if (pBVar18[(long)pbVar11] < (byte)*(ulong *)((long)puVar26 + (long)pbVar11)) {
              *local_110 = uVar20;
              local_108 = pbVar11;
              if (uVar38 < uVar20) {
                pUVar25 = pUVar25 + 1;
                local_110 = pUVar25;
LAB_001b65a2:
                uVar20 = *pUVar25;
                bVar44 = true;
              }
              else {
                bVar44 = false;
                local_110 = &local_6c;
              }
            }
            else {
              *local_e0 = uVar20;
              local_100 = pbVar11;
              local_e0 = pUVar25;
              if (uVar38 < uVar20) goto LAB_001b65a2;
              bVar44 = false;
              local_e0 = &local_6c;
            }
          }
        } while (((bVar44) && (uVar29 = uVar29 - 1, uVar29 != 0)) && (uVar16 < uVar20));
      }
      *local_e0 = 0;
      *local_110 = 0;
      uVar28 = uVar28 + 1;
      uVar24 = (ulong)uVar39;
    } while (uVar39 != 0);
  }
  pBVar4 = (ms->window).dictBase;
  uVar12 = (ulong)(ms->window).dictLimit;
  uVar24 = (ulong)((uVar40 & uVar31) * 2);
  pUVar30 = pUVar42 + uVar24;
  pUVar25 = pUVar42 + uVar24 + 1;
  local_c0 = uVar31 + 9;
  uVar38 = local_58[uVar8];
  local_58[uVar8] = uVar31;
  if (UVar37 < uVar38) {
    uVar8 = 0;
    local_100 = (byte *)0x0;
    local_108 = (byte *)0x0;
    do {
      pbVar17 = local_100;
      if (local_108 < local_100) {
        pbVar17 = local_108;
      }
      uVar24 = (ulong)uVar38;
      if ((dictMode == ZSTD_extDict) && ((long)pbVar17 + uVar24 < uVar12)) {
        pBVar1 = pBVar4 + uVar24;
        sVar10 = ZSTD_count_2segments
                           (ip + (long)pbVar17,pBVar1 + (long)pbVar17,iend,pBVar4 + uVar12,
                            pBVar3 + uVar12);
        uVar13 = sVar10 + (long)pbVar17;
        pUVar42 = local_68;
        pBVar18 = pBVar3 + uVar24;
        if (uVar13 + uVar24 < uVar12) {
          pBVar18 = pBVar1;
        }
      }
      else {
        puVar43 = (ulong *)(ip + (long)pbVar17);
        puVar26 = (ulong *)(pBVar3 + uVar24 + (long)pbVar17);
        puVar32 = puVar43;
        if (puVar43 < iend + -7) {
          uVar14 = *puVar43 ^ *puVar26;
          uVar13 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
            }
          }
          uVar13 = uVar13 >> 3 & 0x1fffffff;
          if (*puVar26 == *puVar43) {
            do {
              puVar32 = puVar32 + 1;
              puVar26 = puVar26 + 1;
              if (iend + -7 <= puVar32) goto LAB_001b67cc;
              uVar14 = *puVar32 ^ *puVar26;
              uVar13 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
                }
              }
              uVar13 = (long)puVar32 + ((uVar13 >> 3 & 0x1fffffff) - (long)puVar43);
            } while (*puVar26 == *puVar32);
          }
        }
        else {
LAB_001b67cc:
          if ((puVar32 < iend + -3) && ((int)*puVar26 == (int)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 4);
            puVar26 = (ulong *)((long)puVar26 + 4);
          }
          if ((puVar32 < iend + -1) && ((short)*puVar26 == (short)*puVar32)) {
            puVar32 = (ulong *)((long)puVar32 + 2);
            puVar26 = (ulong *)((long)puVar26 + 2);
          }
          if (puVar32 < iend) {
            puVar32 = (ulong *)((long)puVar32 + (ulong)((char)*puVar26 == (char)*puVar32));
          }
          uVar13 = (long)puVar32 - (long)puVar43;
        }
        uVar13 = uVar13 + (long)pbVar17;
        pBVar18 = pBVar3 + uVar24;
      }
      if (uVar8 < uVar13) {
        if (local_c0 - uVar38 < uVar13) {
          local_c0 = uVar38 + (int)uVar13;
        }
        uVar34 = (uVar31 - uVar38) + 1;
        iVar21 = 0x1f;
        if (uVar34 != 0) {
          for (; uVar34 >> iVar21 == 0; iVar21 = iVar21 + -1) {
          }
        }
        iVar22 = 0x1f;
        if ((int)*offBasePtr != 0) {
          for (; (uint)*offBasePtr >> iVar22 == 0; iVar22 = iVar22 + -1) {
          }
        }
        if (iVar21 - iVar22 < ((int)uVar13 - (int)uVar8) * 4) {
          if (uVar31 == uVar38) {
            __assert_fail("(curr - matchIndex)>0",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x74c2,
                          "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                         );
          }
          *offBasePtr = (ulong)((uVar31 - uVar38) + 3);
          uVar8 = uVar13;
        }
        if (ip + uVar13 != iend) goto LAB_001b6891;
        uVar34 = 0;
        if (dictMode == ZSTD_dictMatchState) {
          local_124 = uVar34;
        }
      }
      else {
LAB_001b6891:
        pUVar19 = pUVar42 + (uVar38 & uVar40) * 2;
        if (pBVar18[uVar13] < ip[uVar13]) {
          *pUVar30 = uVar38;
          local_108 = (byte *)uVar13;
          if (uVar7 < uVar38) {
            pUVar19 = pUVar19 + 1;
            pUVar30 = pUVar19;
LAB_001b68e7:
            uVar38 = *pUVar19;
            uVar34 = 1;
          }
          else {
            uVar34 = 0;
            pUVar30 = &local_70;
          }
        }
        else {
          *pUVar25 = uVar38;
          pUVar25 = pUVar19;
          local_100 = (byte *)uVar13;
          if (uVar7 < uVar38) goto LAB_001b68e7;
          uVar34 = 0;
          pUVar25 = &local_70;
        }
      }
    } while ((((char)uVar34 != '\0') && (local_124 = local_124 - 1, local_124 != 0)) &&
            (UVar37 < uVar38));
  }
  else {
    uVar8 = 0;
  }
  *pUVar25 = 0;
  *pUVar30 = 0;
  if (0x40000000 < local_124) {
    __assert_fail("nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x74df,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  if ((dictMode == ZSTD_dictMatchState) && (local_124 != 0)) {
    pZVar5 = ms->dictMatchState;
    uVar7 = (pZVar5->cParams).hashLog;
    if (0x20 < uVar7) {
LAB_001b6d11:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
    if ((uint)local_60 < 4) {
      sVar10 = (*(code *)(&DAT_0026c444 + *(int *)(&DAT_0026c444 + local_60 * 4)))
                         (&DAT_0026c444 + *(int *)(&DAT_0026c444 + local_60 * 4));
      return sVar10;
    }
    uVar7 = pZVar5->hashTable[(uint)(*(int *)ip * -0x61c8864f) >> (-(char)uVar7 & 0x1fU)];
    pBVar4 = (pZVar5->window).nextSrc;
    pBVar18 = (pZVar5->window).base;
    uVar24 = (long)pBVar4 - (long)pBVar18;
    uVar40 = (pZVar5->window).lowLimit;
    uVar34 = ~(-1 << ((char)(pZVar5->cParams).chainLog - 1U & 0x1f));
    iVar21 = (int)uVar24;
    uVar38 = iVar21 - uVar34;
    if (iVar21 - uVar40 <= uVar34) {
      uVar38 = uVar40;
    }
    if (uVar40 < uVar7) {
      uVar28 = (ms->window).dictLimit;
      uVar35 = (ms->window).lowLimit - iVar21;
      pUVar42 = pZVar5->chainTable;
      uVar12 = 0;
      local_d0 = 0;
      do {
        local_124 = local_124 - 1;
        uVar13 = uVar12;
        if (local_d0 < uVar12) {
          uVar13 = local_d0;
        }
        uVar14 = (ulong)uVar7;
        pBVar1 = pBVar18 + uVar14;
        sVar10 = ZSTD_count_2segments(ip + uVar13,pBVar1 + uVar13,iend,pBVar4,pBVar3 + uVar28);
        uVar13 = sVar10 + uVar13;
        pBVar27 = pBVar3 + uVar14 + uVar35;
        if (uVar13 + uVar14 < (uVar24 & 0xffffffff)) {
          pBVar27 = pBVar1;
        }
        if (uVar8 < uVar13) {
          uVar16 = uVar35 + uVar7;
          iVar22 = uVar31 - uVar16;
          uVar39 = iVar22 + 1;
          iVar21 = 0x1f;
          if (uVar39 != 0) {
            for (; uVar39 >> iVar21 == 0; iVar21 = iVar21 + -1) {
            }
          }
          uVar39 = (int)*offBasePtr + 1;
          iVar6 = 0x1f;
          if (uVar39 != 0) {
            for (; uVar39 >> iVar6 == 0; iVar6 = iVar6 + -1) {
            }
          }
          if (iVar21 - iVar6 < ((int)uVar13 - (int)uVar8) * 4) {
            if (uVar31 == uVar16) {
              __assert_fail("(curr - matchIndex)>0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x7440,
                            "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                           );
            }
            *offBasePtr = (ulong)(iVar22 + 3);
            uVar8 = uVar13;
          }
          bVar44 = ip + uVar13 == iend;
          if (!bVar44) goto LAB_001b6b87;
        }
        else {
LAB_001b6b87:
          pUVar25 = pUVar42 + (uVar7 & uVar34) * 2;
          if (pBVar27[uVar13] < ip[uVar13]) {
            bVar44 = true;
            if (uVar38 < uVar7) {
              pUVar25 = pUVar25 + 1;
              uVar14 = uVar12;
              local_d0 = uVar13;
LAB_001b6bcc:
              uVar7 = *pUVar25;
              bVar44 = false;
              uVar12 = uVar14;
            }
          }
          else {
            bVar44 = true;
            uVar14 = uVar13;
            if (uVar38 < uVar7) goto LAB_001b6bcc;
          }
        }
      } while (((!bVar44) && (local_124 != 0)) && (uVar40 < uVar7));
    }
    if ((2 < uVar8) && (*offBasePtr < 4)) {
      __assert_fail("OFFBASE_IS_OFFSET(*offsetPtr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x7454,
                    "size_t ZSTD_DUBT_findBetterDictMatch(const ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, size_t, U32, const U32, const ZSTD_dictMode_e)"
                   );
    }
  }
  if (local_c0 <= uVar31 + 8) {
    __assert_fail("matchEndIdx > curr+8",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x74e7,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  ms->nextToUpdate = local_c0 - 8;
  if ((2 < uVar8) && (*offBasePtr < 4)) {
    __assert_fail("OFFBASE_IS_OFFSET(*offBasePtr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x74ea,
                  "size_t ZSTD_DUBT_findBestMatch(ZSTD_matchState_t *, const BYTE *const, const BYTE *const, size_t *, const U32, const ZSTD_dictMode_e)"
                 );
  }
  return uVar8;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offBasePtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        for (; nbCompares && (matchIndex > windowLow); --nbCompares) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr - matchIndex + 1) - ZSTD_highbit32((U32)*offBasePtr)) )
                    bestLength = matchLength, *offBasePtr = OFFSET_TO_OFFBASE(curr - matchIndex);
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        assert(nbCompares <= (1U << ZSTD_SEARCHLOG_MAX)); /* Check we haven't underflowed. */
        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offBasePtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - (U32)OFFBASE_TO_OFFSET(*offBasePtr); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offBasePtr, mIndex);
        }
        return bestLength;
    }
}